

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O3

int Bmc_BmciPart_rec(Gia_Man_t *pNew,Vec_Int_t *vSatMap,int iIdNew,Gia_Man_t *pPart,
                    Vec_Int_t *vPartMap,Vec_Int_t *vCopies)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pFanout;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if ((iIdNew < 0) || (pNew->nObjs <= iIdNew)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (vCopies->nSize <= iIdNew) {
LAB_0051b956:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if (vCopies->pArray[(uint)iIdNew] != 0) {
    return vCopies->pArray[(uint)iIdNew];
  }
  if (vSatMap->nSize <= iIdNew) goto LAB_0051b956;
  if (vSatMap->pArray[(uint)iIdNew] < 0) {
    pGVar8 = pNew->pObjs + (uint)iIdNew;
    uVar4 = (uint)*(ulong *)pGVar8;
    if ((uVar4 & 0x9fffffff) != 0x9fffffff) {
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmci.c"
                      ,0x83,
                      "int Bmc_BmciPart_rec(Gia_Man_t *, Vec_Int_t *, int, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      uVar3 = Bmc_BmciPart_rec(pNew,vSatMap,iIdNew - (uVar4 & 0x1fffffff),pPart,vPartMap,vCopies);
      uVar4 = Bmc_BmciPart_rec(pNew,vSatMap,iIdNew - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff),
                               pPart,vPartMap,vCopies);
      if (((int)uVar3 < 0) || ((int)uVar4 < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar11 = *(ulong *)pGVar8;
      Vec_IntPush(vPartMap,iIdNew);
      pFanout = Gia_ManAppendObj(pPart);
      uVar6 = uVar3 >> 1;
      uVar1 = pPart->nObjs;
      if ((int)uVar1 <= (int)uVar6) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x27a,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar5 = uVar4 >> 1;
      if (uVar1 <= uVar5) {
        __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x27b,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      if ((uVar6 == uVar5) && (pPart->fGiaSimple == 0)) {
        __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x27c,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
      }
      uVar3 = (uint)(uVar11 >> 0x1d) & 1 ^ uVar3;
      uVar4 = (uint)(uVar11 >> 0x3d) & 1 ^ uVar4;
      pGVar8 = pPart->pObjs;
      iVar2 = (int)pFanout;
      if (uVar3 < uVar4) {
        if (pGVar8 + uVar1 <= pFanout || pFanout < pGVar8) goto LAB_0051b937;
        uVar11 = *(ulong *)pFanout;
        uVar7 = (ulong)((uVar3 & 1) << 0x1d |
                       ((uint)(iVar2 - (int)pGVar8) >> 2) * -0x55555555 - uVar6 & 0x1fffffff);
        *(ulong *)pFanout = uVar7 | uVar11 & 0xffffffffc0000000;
        pGVar8 = pPart->pObjs;
        if ((pFanout < pGVar8) || (pGVar8 + pPart->nObjs <= pFanout)) goto LAB_0051b937;
        uVar11 = (ulong)(uVar4 & 1) << 0x3d |
                 uVar7 | uVar11 & 0xc0000000c0000000 |
                 (ulong)(((uint)(iVar2 - (int)pGVar8) >> 2) * -0x55555555 - uVar5 & 0x1fffffff) <<
                 0x20;
      }
      else {
        if (pGVar8 + uVar1 <= pFanout || pFanout < pGVar8) goto LAB_0051b937;
        uVar11 = *(ulong *)pFanout;
        uVar9 = (ulong)(((uint)(iVar2 - (int)pGVar8) >> 2) * -0x55555555 - uVar6 & 0x1fffffff) <<
                0x20;
        uVar7 = (ulong)(uVar3 & 1) << 0x3d;
        *(ulong *)pFanout = uVar7 | uVar11 & 0xc0000000ffffffff | uVar9;
        pGVar8 = pPart->pObjs;
        if ((pFanout < pGVar8) || (pGVar8 + pPart->nObjs <= pFanout)) goto LAB_0051b937;
        uVar11 = (ulong)((uVar4 & 1) << 0x1d) | uVar7 | uVar11 & 0xc0000000c0000000 | uVar9 |
                 (ulong)(((uint)(iVar2 - (int)pGVar8) >> 2) * -0x55555555 - uVar5 & 0x1fffffff);
      }
      *(ulong *)pFanout = uVar11;
      if (pPart->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(pPart,pFanout + -(uVar11 & 0x1fffffff),pFanout);
        Gia_ObjAddFanout(pPart,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout
                        );
      }
      if (pPart->fSweeper != 0) {
        uVar7 = *(ulong *)pFanout & 0x1fffffff;
        uVar11 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
        uVar9 = 0x4000000000000000;
        uVar10 = 0x4000000000000000;
        if (((uint)*(ulong *)(pFanout + -uVar7) >> 0x1e & 1) == 0) {
          uVar10 = 0x40000000;
        }
        *(ulong *)(pFanout + -uVar7) = uVar10 | *(ulong *)(pFanout + -uVar7);
        uVar10 = *(ulong *)(pFanout + -uVar11);
        if (((uint)uVar10 >> 0x1e & 1) == 0) {
          uVar9 = 0x40000000;
        }
        *(ulong *)(pFanout + -uVar11) = uVar9 | uVar10;
        uVar11 = *(ulong *)pFanout;
        *(ulong *)pFanout =
             uVar11 & 0x7fffffffffffffff |
             (ulong)(((uint)(uVar11 >> 0x3d) ^ (uint)(uVar10 >> 0x3f)) &
                    ((uint)((ulong)*(undefined8 *)(pFanout + -uVar7) >> 0x3f) ^
                    (uint)(uVar11 >> 0x1d) & 7)) << 0x3f;
      }
      pGVar8 = pPart->pObjs;
      if ((pFanout < pGVar8) || (pGVar8 + pPart->nObjs <= pFanout)) goto LAB_0051b937;
      iVar2 = vCopies->nSize;
      goto joined_r0x0051b8f3;
    }
  }
  Vec_IntPush(vPartMap,iIdNew);
  pFanout = Gia_ManAppendObj(pPart);
  uVar11 = *(ulong *)pFanout;
  *(ulong *)pFanout = uVar11 | 0x9fffffff;
  *(ulong *)pFanout =
       uVar11 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pPart->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar8 = pPart->pObjs;
  if ((pGVar8 <= pFanout) && (pFanout < pGVar8 + pPart->nObjs)) {
    Vec_IntPush(pPart->vCis,(int)((ulong)((long)pFanout - (long)pGVar8) >> 2) * -0x55555555);
    pGVar8 = pPart->pObjs;
    if ((pGVar8 <= pFanout) && (pFanout < pGVar8 + pPart->nObjs)) {
      iVar2 = vCopies->nSize;
joined_r0x0051b8f3:
      if (iIdNew < iVar2) {
        iVar2 = (int)((ulong)((long)pFanout - (long)pGVar8) >> 2) * 0x55555556;
        vCopies->pArray[(uint)iIdNew] = iVar2;
        return iVar2;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
LAB_0051b937:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Bmc_BmciPart_rec( Gia_Man_t * pNew, Vec_Int_t * vSatMap, int iIdNew, Gia_Man_t * pPart, Vec_Int_t * vPartMap, Vec_Int_t * vCopies )
{
    Gia_Obj_t * pObj = Gia_ManObj( pNew, iIdNew ); 
    int iLitPart0, iLitPart1, iRes;
    if ( Vec_IntEntry(vCopies, iIdNew) )
        return Vec_IntEntry(vCopies, iIdNew);
    if ( Vec_IntEntry(vSatMap, iIdNew) >= 0 || Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vPartMap, iIdNew );
        iRes = Gia_ManAppendCi(pPart);
        Vec_IntWriteEntry( vCopies, iIdNew, iRes );
        return iRes;
    }
    assert( Gia_ObjIsAnd(pObj) );
    iLitPart0 = Bmc_BmciPart_rec( pNew, vSatMap, Gia_ObjFaninId0(pObj, iIdNew), pPart, vPartMap, vCopies );
    iLitPart1 = Bmc_BmciPart_rec( pNew, vSatMap, Gia_ObjFaninId1(pObj, iIdNew), pPart, vPartMap, vCopies );
    iLitPart0 = Abc_LitNotCond( iLitPart0, Gia_ObjFaninC0(pObj) );
    iLitPart1 = Abc_LitNotCond( iLitPart1, Gia_ObjFaninC1(pObj) );
    Vec_IntPush( vPartMap, iIdNew );
    iRes = Gia_ManAppendAnd( pPart, iLitPart0, iLitPart1 );
    Vec_IntWriteEntry( vCopies, iIdNew, iRes );
    return iRes;
}